

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fp8.cpp
# Opt level: O0

void __thiscall MILBlob::Fp8E5M2::SetFloat(Fp8E5M2 *this,float f)

{
  uint uVar1;
  int iVar2;
  range_error *prVar3;
  int32_t unbiasedExponent;
  float local_14;
  FloatCast fp32;
  float f_local;
  Fp8E5M2 *this_local;
  
  (this->data).byte = '\0';
  (this->data).byte = (this->data).byte & 0x7f | (byte)((uint)f >> 0x18) & 0x80;
  unbiasedExponent = (int32_t)f;
  local_14 = f;
  _fp32 = this;
  uVar1 = std::isnan((double)(ulong)(uint)f);
  if ((uVar1 & 1) == 0) {
    uVar1 = std::isinf((double)(ulong)(uint)local_14);
    if ((uVar1 & 1) == 0) {
      if ((local_14 != 0.0) || (NAN(local_14))) {
        iVar2 = ((uint)unbiasedExponent >> 0x17 & 0xff) - 0x7f;
        if (0xf < iVar2) {
          prVar3 = (range_error *)__cxa_allocate_exception(0x10);
          std::range_error::range_error(prVar3,"Fp8E5M2 SetFloat exponent overflow.");
          __cxa_throw(prVar3,&std::range_error::typeinfo,std::range_error::~range_error);
        }
        if (iVar2 < -0x10) {
          prVar3 = (range_error *)__cxa_allocate_exception(0x10);
          std::range_error::range_error(prVar3,"Fp8E5M2 SetFloat exponent underflow.");
          __cxa_throw(prVar3,&std::range_error::typeinfo,std::range_error::~range_error);
        }
        HandleFp32ToFp8ExponentMantissa<MILBlob::Fp8E5M2,MILBlob::Fp8E5M2::Cast>
                  (&this->data,(FloatCast *)&unbiasedExponent);
      }
      else {
        (this->data).byte = (this->data).byte & 0x83;
        (this->data).byte = (this->data).byte & 0xfc;
      }
    }
    else {
      (this->data).byte = (this->data).byte & 0x83 | 0x7c;
      (this->data).byte = (this->data).byte & 0xfc;
    }
  }
  else {
    (this->data).byte = (this->data).byte & 0x83 | 0x7c;
    (this->data).byte = (this->data).byte & 0xfc | 1;
  }
  return;
}

Assistant:

void Fp8E5M2::SetFloat(float f)
{
    FloatCast fp32 = {.f = f};
    data = {.byte = 0};
    // Set sign bit.
    data.components.sign = fp32.components.sign;

    // If f is nan or inf, set exponent to all 1's.
    if (std::isnan(f)) {
        data.components.exponent = (0x1 << fp8ExponentBits) - 1;
        data.components.mantissa = 1;
    } else if (std::isinf(f)) {
        data.components.exponent = (0x1 << fp8ExponentBits) - 1;
        data.components.mantissa = 0;
    } else if (f == 0) {
        data.components.exponent = 0;
        data.components.mantissa = 0;
    } else {
        int32_t unbiasedExponent = fp32.components.exponent - fp32ExponentBias;
        // Float is normal or denormal, check the exponent and set it.
        // For now, we throw on over/underflows. There are alternative ways to handle
        // this (round to zero).
        if (unbiasedExponent > fp8ExponentBias) {
            throw std::range_error("Fp8E5M2 SetFloat exponent overflow.");
        } else if (unbiasedExponent < (-1 * fp8ExponentBias - int32_t(fp8MantissaBits) + 1)) {
            throw std::range_error("Fp8E5M2 SetFloat exponent underflow.");
        }
        HandleFp32ToFp8ExponentMantissa<Fp8E5M2, Fp8E5M2::Cast>(data, fp32);
    }
}